

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::ReadNumAlignmentChunks
          (BamStandardIndex *this,int *numAlignmentChunks)

{
  IBamIODevice *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  BamException *this_00;
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,numAlignmentChunks,4);
  if (this->m_isBigEndian == true) {
    SwapEndian_32(numAlignmentChunks);
  }
  if (CONCAT44(extraout_var,iVar2) == 4) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_40,"BamStandardIndex::ReadNumAlignmentChunks",&local_61);
  std::__cxx11::string::string((string *)&local_60,"could not read BAI chunk count",&local_62);
  BamException::BamException(this_00,&local_40,&local_60);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::ReadNumAlignmentChunks(int& numAlignmentChunks)
{
    const int64_t numBytesRead =
        m_resources.Device->Read((char*)&numAlignmentChunks, sizeof(numAlignmentChunks));
    if (m_isBigEndian) SwapEndian_32(numAlignmentChunks);
    if (numBytesRead != sizeof(numAlignmentChunks))
        throw BamException("BamStandardIndex::ReadNumAlignmentChunks",
                           "could not read BAI chunk count");
}